

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O3

bool __thiscall depspawn::internal::TaskPool::try_run(TaskPool *this)

{
  bool bVar1;
  Task *in_RAX;
  Task *p;
  Task *local_18;
  
  local_18 = in_RAX;
  bVar1 = boost::lockfree::
          queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
          pop<depspawn::internal::TaskPool::Task*>
                    ((queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>
                      *)&this->hp_queue_,&local_18);
  if ((!bVar1) &&
     (bVar1 = boost::lockfree::
              queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
              pop<depspawn::internal::TaskPool::Task*>
                        ((queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>
                          *)&this->queue_,&local_18), !bVar1)) {
    return false;
  }
  Task::run(local_18);
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::free(&this->task_pool_,local_18)
  ;
  return true;
}

Assistant:

bool try_run()
  { Task *p;

    const bool ret = hp_queue_.pop(p) || queue_.pop(p);
    if (ret) {
      run(p);
    }

    return ret;
  }